

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlCtxtNsCheckScope(xmlDebugCtxtPtr ctxt,xmlNodePtr node,xmlNsPtr ns)

{
  xmlElementType xVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  xmlNsPtr pxVar5;
  
  iVar4 = -2;
  bVar2 = false;
  if ((node->type < XML_XINCLUDE_END) &&
     (bVar2 = false, (0x8220eU >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
    if (node != (xmlNodePtr)0x0) {
      while (xVar1 = node->type, xVar1 < XML_XINCLUDE_END) {
        if ((0xcU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
          if ((0x80002U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
            if (((0x2200U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) &&
               (node->nsDef == ns)) {
LAB_001418eb:
              iVar4 = 1;
LAB_001418f0:
              bVar2 = false;
              goto LAB_001418f3;
            }
            break;
          }
          pxVar5 = (xmlNsPtr)&node->nsDef;
          while (pxVar5 = pxVar5->next, pxVar5 != (xmlNsPtr)0x0) {
            if (pxVar5 == ns) goto LAB_001418eb;
            iVar3 = xmlStrEqual(pxVar5->prefix,ns->prefix);
            iVar4 = -2;
            if (iVar3 != 0) goto LAB_001418f0;
          }
        }
        node = node->parent;
        if (node == (_xmlNode *)0x0) break;
      }
    }
    iVar4 = -3;
    bVar2 = true;
  }
LAB_001418f3:
  if (iVar4 == -3) {
LAB_00141935:
    if (ns->prefix == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x13a7,"Reference to default namespace not on ancestor\n");
      return;
    }
    xmlDebugErr3(ctxt,0x13a7,"Reference to namespace \'%s\' not on ancestor\n",(char *)ns->prefix);
    return;
  }
  if (iVar4 == -2) {
    if (ns->prefix == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x13a6,"Reference to default namespace not in scope\n");
    }
    else {
      xmlDebugErr3(ctxt,0x13a6,"Reference to namespace \'%s\' not in scope\n",(char *)ns->prefix);
    }
    if (bVar2) goto LAB_00141935;
  }
  return;
}

Assistant:

static void
xmlCtxtNsCheckScope(xmlDebugCtxtPtr ctxt, xmlNodePtr node, xmlNsPtr ns)
{
    int ret;

    ret = xmlNsCheckScope(node, ns);
    if (ret == -2) {
        if (ns->prefix == NULL)
	    xmlDebugErr(ctxt, XML_CHECK_NS_SCOPE,
			"Reference to default namespace not in scope\n");
	else
	    xmlDebugErr3(ctxt, XML_CHECK_NS_SCOPE,
			 "Reference to namespace '%s' not in scope\n",
			 (char *) ns->prefix);
    }
    if (ret == -3) {
        if (ns->prefix == NULL)
	    xmlDebugErr(ctxt, XML_CHECK_NS_ANCESTOR,
			"Reference to default namespace not on ancestor\n");
	else
	    xmlDebugErr3(ctxt, XML_CHECK_NS_ANCESTOR,
			 "Reference to namespace '%s' not on ancestor\n",
			 (char *) ns->prefix);
    }
}